

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O0

void __thiscall QCommandLineParser::process(QCommandLineParser *this,QStringList *arguments)

{
  long lVar1;
  bool bVar2;
  QCommandLineParserPrivate *in_RSI;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  char16_t *str;
  char16_t *str_1;
  char16_t *str_2;
  undefined2 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdea;
  undefined1 in_stack_fffffffffffffdeb;
  byte bVar3;
  undefined1 in_stack_fffffffffffffdec;
  undefined1 in_stack_fffffffffffffded;
  byte bVar4;
  undefined1 uVar5;
  undefined1 in_stack_fffffffffffffdee;
  undefined1 in_stack_fffffffffffffdef;
  byte bVar6;
  undefined1 uVar7;
  undefined2 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdfa;
  byte bVar8;
  undefined1 in_stack_fffffffffffffdfb;
  byte includeQtOptions;
  undefined1 in_stack_fffffffffffffdfc;
  byte bVar9;
  undefined1 in_stack_fffffffffffffdfd;
  byte bVar10;
  undefined1 in_stack_fffffffffffffdfe;
  byte bVar11;
  undefined1 in_stack_fffffffffffffdff;
  byte bVar12;
  QArrayDataPointer<char16_t> *name;
  char16_t *in_stack_fffffffffffffe10;
  int exitCode;
  QString *in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  MessageType type;
  QArrayDataPointer<char16_t> local_1a8 [2];
  QStringList *in_stack_fffffffffffffe98;
  QCommandLineParserPrivate *in_stack_fffffffffffffea0;
  QArrayDataPointer<char16_t> local_148;
  QCommandLineParser *in_stack_fffffffffffffed0;
  
  type = (MessageType)((ulong)in_stack_fffffffffffffe20 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  name = in_RDI;
  bVar2 = QCommandLineParserPrivate::parse(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  if (!bVar2) {
    QCoreApplication::applicationName();
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT17(in_stack_fffffffffffffdff,
                                CONCAT16(in_stack_fffffffffffffdfe,
                                         CONCAT15(in_stack_fffffffffffffdfd,
                                                  CONCAT14(in_stack_fffffffffffffdfc,
                                                           CONCAT13(in_stack_fffffffffffffdfb,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffdfa,
                                                  in_stack_fffffffffffffdf8)))))),(size_t)in_RDI);
    ::operator+((QString *)
                CONCAT17(in_stack_fffffffffffffdff,
                         CONCAT16(in_stack_fffffffffffffdfe,
                                  CONCAT15(in_stack_fffffffffffffdfd,
                                           CONCAT14(in_stack_fffffffffffffdfc,
                                                    CONCAT13(in_stack_fffffffffffffdfb,
                                                             CONCAT12(in_stack_fffffffffffffdfa,
                                                                      in_stack_fffffffffffffdf8)))))
                        ),(QLatin1StringView *)in_RDI);
    errorText((QCommandLineParser *)in_stack_fffffffffffffe10);
    exitCode = (int)((ulong)in_stack_fffffffffffffe10 >> 0x20);
    ::operator+((QStringBuilder<QString,_QLatin1StringView> *)
                CONCAT17(in_stack_fffffffffffffdff,
                         CONCAT16(in_stack_fffffffffffffdfe,
                                  CONCAT15(in_stack_fffffffffffffdfd,
                                           CONCAT14(in_stack_fffffffffffffdfc,
                                                    CONCAT13(in_stack_fffffffffffffdfb,
                                                             CONCAT12(in_stack_fffffffffffffdfa,
                                                                      in_stack_fffffffffffffdf8)))))
                        ),(QString *)in_RDI);
    ::operator+((QStringBuilder<QStringBuilder<QString,_QLatin1StringView>,_QString> *)
                CONCAT17(in_stack_fffffffffffffdff,
                         CONCAT16(in_stack_fffffffffffffdfe,
                                  CONCAT15(in_stack_fffffffffffffdfd,
                                           CONCAT14(in_stack_fffffffffffffdfc,
                                                    CONCAT13(in_stack_fffffffffffffdfb,
                                                             CONCAT12(in_stack_fffffffffffffdfa,
                                                                      in_stack_fffffffffffffdf8)))))
                        ),(char16_t *)in_RDI);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1StringView>,_QString>,_char16_t>
                *)CONCAT17(in_stack_fffffffffffffdef,
                           CONCAT16(in_stack_fffffffffffffdee,
                                    CONCAT15(in_stack_fffffffffffffded,
                                             CONCAT14(in_stack_fffffffffffffdec,
                                                      CONCAT13(in_stack_fffffffffffffdeb,
                                                               CONCAT12(in_stack_fffffffffffffdea,
                                                                        in_stack_fffffffffffffde8)))
                                            ))));
    showMessageAndExit(type,in_stack_fffffffffffffe18,exitCode);
  }
  bVar12 = 0;
  bVar11 = 0;
  bVar6 = false;
  if ((in_RDI->d[0xc].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i & 1) != 0) {
    in_stack_fffffffffffffe10 = L"version";
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_148,(Data *)0x0,L"version",7);
    bVar12 = 1;
    QString::QString((QString *)in_RDI,
                     (DataPointer *)
                     CONCAT17(bVar6,CONCAT16(in_stack_fffffffffffffdee,
                                             CONCAT15(in_stack_fffffffffffffded,
                                                      CONCAT14(in_stack_fffffffffffffdec,
                                                               CONCAT13(in_stack_fffffffffffffdeb,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffdea,
                                                  in_stack_fffffffffffffde8)))))));
    bVar11 = 1;
    bVar6 = isSet((QCommandLineParser *)in_stack_fffffffffffffe10,(QString *)name);
  }
  uVar7 = bVar6;
  if ((bVar11 & 1) != 0) {
    QString::~QString((QString *)0x1fb233);
  }
  if ((bVar12 & 1) != 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDI);
  }
  if ((bVar6 & 1) != 0) {
    showVersion(in_stack_fffffffffffffed0);
  }
  bVar10 = 0;
  bVar9 = 0;
  bVar4 = false;
  if ((in_RDI->d[0xc].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i & 0x100) != 0) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&stack0xfffffffffffffe88,(Data *)0x0,L"help",4);
    bVar10 = 1;
    QString::QString((QString *)in_RDI,
                     (DataPointer *)
                     CONCAT17(uVar7,CONCAT16(bVar6,CONCAT15(bVar4,CONCAT14(in_stack_fffffffffffffdec
                                                                           ,CONCAT13(
                                                  in_stack_fffffffffffffdeb,
                                                  CONCAT12(in_stack_fffffffffffffdea,
                                                           in_stack_fffffffffffffde8)))))));
    bVar9 = 1;
    bVar4 = isSet((QCommandLineParser *)in_stack_fffffffffffffe10,(QString *)name);
  }
  uVar5 = bVar4;
  if ((bVar9 & 1) != 0) {
    QString::~QString((QString *)0x1fb311);
  }
  if ((bVar10 & 1) != 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDI);
  }
  if ((bVar4 & 1) != 0) {
    QCommandLineParserPrivate::showHelp
              (in_RSI,CONCAT13(bVar12,CONCAT12(bVar11,CONCAT11(bVar10,bVar9))),
               (bool)in_stack_fffffffffffffdfb);
  }
  includeQtOptions = 0;
  bVar8 = 0;
  bVar3 = false;
  if ((in_RDI->d[0xc].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i & 0x100) != 0) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_1a8,(Data *)0x0,L"help-all",8);
    includeQtOptions = 1;
    QString::QString((QString *)in_RDI,
                     (DataPointer *)
                     CONCAT17(uVar7,CONCAT16(bVar6,CONCAT15(uVar5,CONCAT14(bVar4,CONCAT13(bVar3,
                                                  CONCAT12(in_stack_fffffffffffffdea,
                                                           in_stack_fffffffffffffde8)))))));
    bVar8 = 1;
    bVar3 = isSet((QCommandLineParser *)in_stack_fffffffffffffe10,(QString *)name);
  }
  if ((bVar8 & 1) != 0) {
    QString::~QString((QString *)0x1fb3ed);
  }
  if ((includeQtOptions & 1) != 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDI);
  }
  if ((bVar3 & 1) != 0) {
    QCommandLineParserPrivate::showHelp
              (in_RSI,CONCAT13(bVar12,CONCAT12(bVar11,CONCAT11(bVar10,bVar9))),
               (bool)includeQtOptions);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCommandLineParser::process(const QStringList &arguments)
{
    if (!d->parse(arguments)) {
        showMessageAndExit(MessageType::Error,
                           QCoreApplication::applicationName() + ": "_L1 + errorText() + u'\n',
                           EXIT_FAILURE);
    }

    if (d->builtinVersionOption && isSet(QStringLiteral("version")))
        showVersion();

    if (d->builtinHelpOption && isSet(QStringLiteral("help")))
        d->showHelp(EXIT_SUCCESS, false);

    if (d->builtinHelpOption && isSet(QStringLiteral("help-all")))
        d->showHelp(EXIT_SUCCESS, true);
}